

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMisc.cpp
# Opt level: O2

bool Imf_2_5::usesLongNames(Header *header)

{
  bool bVar1;
  const_iterator cVar2;
  ConstIterator CVar3;
  size_t sVar4;
  char *__s;
  ChannelList *this;
  const_iterator cVar5;
  ConstIterator CVar6;
  
  cVar2._M_node = (_Base_ptr)Header::begin(header);
  while( true ) {
    CVar3 = Header::end(header);
    if ((const_iterator)cVar2._M_node == CVar3._i._M_node) {
      this = Header::channels(header);
      cVar5._M_node = (_Base_ptr)ChannelList::begin(this);
      while( true ) {
        CVar6 = ChannelList::end(this);
        bVar1 = (const_iterator)cVar5._M_node != CVar6._i._M_node;
        if ((const_iterator)cVar5._M_node == CVar6._i._M_node) {
          return bVar1;
        }
        sVar4 = strlen((char *)(cVar5._M_node + 1));
        if (0x1f < sVar4) break;
        cVar5._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar5._M_node);
      }
      return bVar1;
    }
    sVar4 = strlen((char *)(cVar2._M_node + 1));
    if (0x1f < sVar4) break;
    __s = (char *)(**(code **)(**(long **)(cVar2._M_node + 9) + 0x10))();
    sVar4 = strlen(__s);
    if (0x1f < sVar4) {
      return true;
    }
    cVar2._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar2._M_node);
  }
  return true;
}

Assistant:

bool
usesLongNames (const Header &header)
{
    //
    // If an OpenEXR file contains any attribute names, attribute type names
    // or channel names longer than 31 characters, then the file cannot be
    // read by older versions of the IlmImf library (up to OpenEXR 1.6.1).
    // Before writing the file header, we check if the header contains
    // any names longer than 31 characters; if it does, then we set the
    // LONG_NAMES_FLAG in the file version number.  Older versions of the
    // IlmImf library will refuse to read files that have the LONG_NAMES_FLAG
    // set.  Without the flag, older versions of the library would mis-
    // interpret the file as broken.
    //

    for (Header::ConstIterator i = header.begin();
         i != header.end();
         ++i)
    {
        if (strlen (i.name()) >= 32 || strlen (i.attribute().typeName()) >= 32)
            return true;
    }

    const ChannelList &channels = header.channels();

    for (ChannelList::ConstIterator i = channels.begin();
         i != channels.end();
         ++i)
    {
        if (strlen (i.name()) >= 32)
            return true;
    }

    return false;
}